

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::GLMClassifier::_InternalParse
          (GLMClassifier *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  GLMClassifier_DoubleArray *msg;
  StringVector *msg_00;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar3;
  char cVar4;
  uint32_t tag;
  double *local_50;
  uint local_44;
  InternalMetadata *local_40;
  RepeatedField<double> *local_38;
  
  local_38 = &this->offset_;
  local_40 = &(this->super_MessageLite)._internal_metadata_;
  local_50 = (double *)ptr;
LAB_001a4351:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_50);
    if (bVar1) {
      return (char *)local_50;
    }
    local_50 = (double *)google::protobuf::internal::ReadTag((char *)local_50,&local_44,0);
    tag_00 = local_44;
    uVar3 = local_44 >> 3;
    cVar4 = (char)local_44;
    switch(uVar3) {
    case 1:
      if (cVar4 == '\n') {
        local_50 = (double *)((long)local_50 + -1);
        do {
          local_50 = (double *)((long)local_50 + 1);
          msg = google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                ::Add(&this->weights_);
          local_50 = (double *)
                     google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,(char *)local_50);
          if (local_50 == (double *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(char *)local_50 == '\n'));
        goto LAB_001a4351;
      }
      break;
    case 2:
      if (cVar4 == '\x12') {
        local_50 = (double *)
                   google::protobuf::internal::PackedDoubleParser(local_38,(char *)local_50,ctx);
        goto LAB_001a44d5;
      }
      if ((local_44 & 0xff) != 0x11) break;
      _internal_add_offset(this,*local_50);
      local_50 = local_50 + 1;
      goto LAB_001a4351;
    case 3:
      if (cVar4 == '\x18') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_50);
        if (local_50 == (double *)0x0) {
          return (char *)0x0;
        }
        this->postevaluationtransform_ = (int)uVar2;
        goto LAB_001a4351;
      }
      break;
    case 4:
      if (cVar4 == ' ') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_50);
        if (local_50 == (double *)0x0) {
          return (char *)0x0;
        }
        this->classencoding_ = (int)uVar2;
        goto LAB_001a4351;
      }
      break;
    default:
      if (uVar3 == 100) {
        if (cVar4 == '\"') {
          msg_00 = _internal_mutable_stringclasslabels(this);
          goto LAB_001a4419;
        }
      }
      else if ((uVar3 == 0x65) && (cVar4 == '*')) {
        msg_00 = (StringVector *)_internal_mutable_int64classlabels(this);
LAB_001a4419:
        local_50 = (double *)
                   google::protobuf::internal::ParseContext::ParseMessage
                             (ctx,&msg_00->super_MessageLite,(char *)local_50);
        goto LAB_001a44d5;
      }
    }
    if ((local_44 == 0) || ((local_44 & 7) == 4)) {
      if (local_50 == (double *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
      return (char *)local_50;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_40);
    local_50 = (double *)
               google::protobuf::internal::UnknownFieldParse(tag_00,unknown,(char *)local_50,ctx);
LAB_001a44d5:
    if (local_50 == (double *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* GLMClassifier::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_weights(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated double offset = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_offset(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 17) {
          _internal_add_offset(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_postevaluationtransform(static_cast<::CoreML::Specification::GLMClassifier_PostEvaluationTransform>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 32)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_classencoding(static_cast<::CoreML::Specification::GLMClassifier_ClassEncoding>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringclasslabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64classlabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}